

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O3

bool illegalIpxStoppedCrossoverStatus(Info *ipx_info,HighsOptions *options)

{
  int iVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  bool bVar4;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar1 = (ipx_info->super_ipx_info).status_crossover;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"stopped status_crossover should not be IPX_STATUS_optimal","");
  if (iVar1 == 1) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_48[0]);
    fflush((FILE *)0x0);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar1 == 1) {
    return true;
  }
  iVar1 = (ipx_info->super_ipx_info).status_crossover;
  puVar3 = local_78;
  local_88[0] = puVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"stopped status_crossover should not be IPX_STATUS_imprecise","");
  if (iVar1 == 2) {
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_88[0]);
    fflush((FILE *)0x0);
    puVar2 = local_88[0];
  }
  else {
    if (local_88[0] != puVar3) {
      operator_delete(local_88[0]);
    }
    iVar1 = (ipx_info->super_ipx_info).status_crossover;
    puVar3 = local_98;
    local_a8[0] = puVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"stopped status_crossover should not be IPX_STATUS_primal_infeas",
               "");
    if (iVar1 == 3) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_a8[0]);
      fflush((FILE *)0x0);
      puVar2 = local_a8[0];
    }
    else {
      if (local_a8[0] != puVar3) {
        operator_delete(local_a8[0]);
      }
      iVar1 = (ipx_info->super_ipx_info).status_crossover;
      puVar3 = local_b8;
      local_c8[0] = puVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"stopped status_crossover should not be IPX_STATUS_dual_infeas",
                 "");
      if (iVar1 == 4) {
        highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",local_c8[0]
                    );
        fflush((FILE *)0x0);
        puVar2 = local_c8[0];
      }
      else {
        if (local_c8[0] != puVar3) {
          operator_delete(local_c8[0]);
        }
        iVar1 = (ipx_info->super_ipx_info).status_crossover;
        puVar3 = local_d8;
        local_e8[0] = puVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,"stopped status_crossover should not be IPX_STATUS_iter_limit"
                   ,"");
        if (iVar1 == 7) {
          highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",
                       local_e8[0]);
          fflush((FILE *)0x0);
          puVar2 = local_e8[0];
        }
        else {
          if (local_e8[0] != puVar3) {
            operator_delete(local_e8[0]);
          }
          iVar1 = (ipx_info->super_ipx_info).status_crossover;
          puVar3 = local_f8;
          local_108[0] = puVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,
                     "stopped status_crossover should not be IPX_STATUS_no_progress","");
          if (iVar1 == 8) {
            highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",
                         local_108[0]);
            fflush((FILE *)0x0);
            puVar2 = local_108[0];
          }
          else {
            if (local_108[0] != puVar3) {
              operator_delete(local_108[0]);
            }
            iVar1 = (ipx_info->super_ipx_info).status_crossover;
            puVar3 = local_118;
            local_128[0] = puVar3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_128,
                       "stopped status_crossover should not be IPX_STATUS_failed","");
            if (iVar1 != 9) {
              if (local_128[0] != puVar3) {
                operator_delete(local_128[0]);
              }
              iVar1 = (ipx_info->super_ipx_info).status_crossover;
              local_68[0] = local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,
                         "stopped status_crossover should not be IPX_STATUS_debug","");
              bVar4 = iVar1 == 10;
              if (bVar4) {
                highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",
                             local_68[0]);
                fflush((FILE *)0x0);
              }
              puVar2 = local_68[0];
              if (local_68[0] == local_58) {
                return bVar4;
              }
              goto LAB_00202763;
            }
            highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"Ipx: %s\n",
                         local_128[0]);
            fflush((FILE *)0x0);
            puVar2 = local_128[0];
          }
        }
      }
    }
  }
  bVar4 = true;
  if (puVar2 == puVar3) {
    return true;
  }
LAB_00202763:
  operator_delete(puVar2);
  return bVar4;
}

Assistant:

bool illegalIpxStoppedCrossoverStatus(const ipx::Info& ipx_info,
                                      const HighsOptions& options) {
  bool found_illegal_status = false;
  // Cannot stop and be optimal
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_optimal, options,
          "stopped status_crossover should not be IPX_STATUS_optimal");
  // Cannot stop and be imprecise
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_imprecise, options,
          "stopped status_crossover should not be IPX_STATUS_imprecise");
  // Cannot stop with primal infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_primal_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_primal_infeas");
  // Cannot stop with dual infeasibility
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_dual_infeas, options,
          "stopped status_crossover should not be IPX_STATUS_dual_infeas");
  // Cannot stop and reach iteration limit
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_iter_limit, options,
          "stopped status_crossover should not be IPX_STATUS_iter_limit");
  // Can stop and reach time limit
  // Cannot stop with no_progress
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_no_progress, options,
          "stopped status_crossover should not be IPX_STATUS_no_progress");
  // Cannot stop and failed - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(
          ipx_info.status_crossover == IPX_STATUS_failed, options,
          "stopped status_crossover should not be IPX_STATUS_failed");
  // Cannot stop and debug - should be error return earlier
  found_illegal_status =
      found_illegal_status ||
      ipxStatusError(ipx_info.status_crossover == IPX_STATUS_debug, options,
                     "stopped status_crossover should not be IPX_STATUS_debug");
  return found_illegal_status;
}